

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

SchnorrPubkey *
cfd::core::SchnorrPubkey::FromPrivkey
          (SchnorrPubkey *__return_storage_ptr__,Privkey *privkey,bool *parity)

{
  int iVar1;
  secp256k1_context_struct *ctx_00;
  uchar *seckey32;
  CfdException *pCVar2;
  ByteData256 local_150;
  int local_138;
  undefined1 local_132 [2];
  int pk_parity;
  secp256k1_xonly_pubkey x_only_pubkey;
  ByteData local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  int local_8c;
  undefined1 local_88 [4];
  int ret;
  secp256k1_keypair keypair;
  secp256k1_context_struct *ctx;
  bool *parity_local;
  Privkey *privkey_local;
  
  ctx_00 = wally_get_secp_context();
  keypair.data._88_8_ = ctx_00;
  Privkey::GetData(&local_c0,privkey);
  ByteData::GetBytes(&local_a8,&local_c0);
  seckey32 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
  iVar1 = secp256k1_keypair_create(ctx_00,(secp256k1_keypair *)local_88,seckey32);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
  ByteData::~ByteData(&local_c0);
  local_8c = iVar1;
  if (iVar1 != 1) {
    x_only_pubkey.data[0x38] = '\x01';
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(x_only_pubkey.data + 0x3a),"Invalid private key",
               (allocator *)(x_only_pubkey.data + 0x39));
    CfdException::CfdException
              (pCVar2,kCfdIllegalArgumentError,(string *)(x_only_pubkey.data + 0x3a));
    x_only_pubkey.data[0x38] = '\0';
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_138 = 0;
  local_8c = secp256k1_keypair_xonly_pub
                       ((secp256k1_context *)keypair.data._88_8_,(secp256k1_xonly_pubkey *)local_132
                        ,&local_138,(secp256k1_keypair *)local_88);
  if (local_8c != 1) {
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    CfdException::CfdException(pCVar2,kCfdInternalError);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (parity != (bool *)0x0) {
    *parity = local_138 != 0;
  }
  ConvertSchnorrPubkey(&local_150,(secp256k1_xonly_pubkey *)local_132);
  SchnorrPubkey(__return_storage_ptr__,&local_150);
  ByteData256::~ByteData256(&local_150);
  return __return_storage_ptr__;
}

Assistant:

SchnorrPubkey SchnorrPubkey::FromPrivkey(
    const Privkey &privkey, bool *parity) {
  auto ctx = wally_get_secp_context();
  secp256k1_keypair keypair;
  auto ret = secp256k1_keypair_create(
      ctx, &keypair, privkey.GetData().GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid private key");
  }

  secp256k1_xonly_pubkey x_only_pubkey;
  int pk_parity = 0;
  ret = secp256k1_keypair_xonly_pub(ctx, &x_only_pubkey, &pk_parity, &keypair);

  if (ret != 1) {
    throw CfdException(CfdError::kCfdInternalError);
  }

  if (parity != nullptr) *parity = (pk_parity != 0);
  return SchnorrPubkey(ConvertSchnorrPubkey(x_only_pubkey));
}